

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O3

void __thiscall xe::ri::ShaderProgram::~ShaderProgram(ShaderProgram *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__ShaderProgram_0011e9a8;
  (this->linkInfoLog).super_Item._vptr_Item = (_func_int **)&PTR__InfoLog_0011e9e0;
  pcVar2 = (this->linkInfoLog).log._M_dataplus._M_p;
  paVar1 = &(this->linkInfoLog).log.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  List::~List(&this->shaders);
  return;
}

Assistant:

~ShaderProgram		(void) {}